

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O3

FT_Error FT_Raccess_Get_DataOffsets
                   (FT_Library library,FT_Stream stream,FT_Long map_offset,FT_Long rdata_pos,
                   FT_Long tag,FT_Bool sort_by_res_id,FT_Long **offsets,FT_Long *count)

{
  FT_Stream pFVar1;
  FT_UInt16 FVar2;
  FT_UInt16 FVar3;
  FT_UInt32 FVar4;
  unsigned_long uVar5;
  void *__base;
  FT_Long *pFVar6;
  long *plVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong *puVar11;
  size_t __nmemb;
  undefined3 in_register_00000089;
  FT_Error FVar12;
  FT_Error local_64;
  FT_Stream local_60;
  FT_Memory local_58;
  undefined4 local_4c;
  unsigned_long local_48;
  FT_Long local_40;
  FT_Long local_38;
  
  local_4c = CONCAT31(in_register_00000089,sort_by_res_id);
  local_58 = library->memory;
  local_48 = map_offset;
  local_40 = rdata_pos;
  local_38 = tag;
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if (stream->size < (ulong)map_offset) {
      return 0x55;
    }
  }
  else {
    uVar5 = (*stream->read)(stream,map_offset,(uchar *)0x0,0);
    if (uVar5 != 0) {
      return 0x55;
    }
  }
  stream->pos = local_48;
  local_64 = 0;
  FVar2 = FT_Stream_ReadUShort(stream,&local_64);
  if (local_64 != 0) {
    return local_64;
  }
  if (0xfee < (short)FVar2) {
    return 8;
  }
  if (-1 < (short)FVar2) {
    iVar8 = (short)FVar2 + 1;
    local_60 = stream;
    do {
      FVar4 = FT_Stream_ReadULong(stream,&local_64);
      if (local_64 != 0) {
        return local_64;
      }
      FVar2 = FT_Stream_ReadUShort(stream,&local_64);
      if (local_64 != 0) {
        return local_64;
      }
      FVar3 = FT_Stream_ReadUShort(stream,&local_64);
      pFVar1 = local_60;
      if (local_64 != 0) {
        return local_64;
      }
      if ((int)FVar4 == local_38) {
        *count = (long)(short)FVar2 + 1;
        if (0xaa6 < FVar2) {
          return 8;
        }
        uVar9 = (long)(short)FVar3 + local_48;
        if (local_60->read == (FT_Stream_IoFunc)0x0) {
          if (local_60->size < uVar9) {
            return 0x55;
          }
        }
        else {
          uVar5 = (*local_60->read)(local_60,uVar9,(uchar *)0x0,0);
          if (uVar5 != 0) {
            return 0x55;
          }
        }
        pFVar1->pos = uVar9;
        uVar9 = *count;
        if ((long)uVar9 < 0) {
          return 6;
        }
        if (uVar9 == 0) {
          __base = (void *)0x0;
          __nmemb = 0;
          goto LAB_00217af0;
        }
        if (0x7ffffff < uVar9) {
          return 10;
        }
        __base = (*local_58->alloc)(local_58,uVar9 << 4);
        pFVar1 = local_60;
        if (__base == (void *)0x0) {
          return 0x40;
        }
        __nmemb = *count;
        local_64 = 0;
        if ((long)__nmemb < 1) goto LAB_00217af0;
        puVar11 = (ulong *)((long)__base + 8);
        lVar10 = 0;
        goto LAB_002179fb;
      }
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  return 1;
LAB_002179fb:
  do {
    local_64 = 0;
    FVar2 = FT_Stream_ReadUShort(pFVar1,&local_64);
    *(FT_UInt16 *)(puVar11 + -1) = FVar2;
    FVar12 = local_64;
    if (local_64 != 0) goto LAB_00217b83;
    uVar9 = pFVar1->pos + 2;
    if (pFVar1->read == (FT_Stream_IoFunc)0x0) {
      if (uVar9 <= pFVar1->size) goto LAB_00217a4b;
LAB_00217b9e:
      FVar12 = 0x55;
      goto LAB_00217b83;
    }
    uVar5 = (*pFVar1->read)(pFVar1,uVar9,(uchar *)0x0,0);
    if (uVar5 != 0) goto LAB_00217b9e;
LAB_00217a4b:
    pFVar1->pos = uVar9;
    local_64 = 0;
    FVar4 = FT_Stream_ReadULong(pFVar1,&local_64);
    FVar12 = local_64;
    if (local_64 != 0) goto LAB_00217b83;
    uVar9 = pFVar1->pos + 4;
    if (pFVar1->read == (FT_Stream_IoFunc)0x0) {
      if (pFVar1->size < uVar9) goto LAB_00217b9e;
    }
    else {
      uVar5 = (*pFVar1->read)(pFVar1,uVar9,(uchar *)0x0,0);
      if (uVar5 != 0) goto LAB_00217b9e;
    }
    pFVar1->pos = uVar9;
    local_64 = 0;
    if ((int)FVar4 < 0) {
      FVar12 = 8;
      goto LAB_00217b83;
    }
    *puVar11 = (ulong)(FVar4 & 0xffffff);
    lVar10 = lVar10 + 1;
    __nmemb = *count;
    puVar11 = puVar11 + 2;
  } while (lVar10 < (long)__nmemb);
LAB_00217af0:
  if ((char)local_4c != '\0') {
    qsort(__base,__nmemb,0x10,ft_raccess_sort_ref_by_id);
    __nmemb = *count;
  }
  if ((long)__nmemb < 0) {
    FVar12 = 6;
    goto LAB_00217b7a;
  }
  pFVar6 = (FT_Long *)0x0;
  if (__nmemb != 0) {
    FVar12 = 10;
    if (0xfffffff < __nmemb) goto LAB_00217b7a;
    pFVar6 = (FT_Long *)(*local_58->alloc)(local_58,__nmemb << 3);
    if (pFVar6 == (FT_Long *)0x0) {
      FVar12 = 0x40;
      goto LAB_00217b7a;
    }
    if (0 < *count) {
      plVar7 = (long *)((long)__base + 8);
      lVar10 = 0;
      do {
        pFVar6[lVar10] = *plVar7 + local_40;
        lVar10 = lVar10 + 1;
        plVar7 = plVar7 + 2;
      } while (lVar10 < *count);
    }
  }
  *offsets = pFVar6;
  FVar12 = 0;
LAB_00217b7a:
  if (__base != (void *)0x0) {
LAB_00217b83:
    (*local_58->free)(local_58,__base);
  }
  return FVar12;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Raccess_Get_DataOffsets( FT_Library  library,
                              FT_Stream   stream,
                              FT_Long     map_offset,
                              FT_Long     rdata_pos,
                              FT_Long     tag,
                              FT_Bool     sort_by_res_id,
                              FT_Long   **offsets,
                              FT_Long    *count )
  {
    FT_Error      error;
    int           i, j, cnt, subcnt;
    FT_Long       tag_internal, rpos;
    FT_Memory     memory = library->memory;
    FT_Long       temp;
    FT_Long       *offsets_internal = NULL;
    FT_RFork_Ref  *ref = NULL;


    FT_TRACE3(( "\n" ));
    error = FT_Stream_Seek( stream, (FT_ULong)map_offset );
    if ( error )
      return error;

    if ( FT_READ_SHORT( cnt ) )
      return error;
    cnt++;

    /* `rpos' is a signed 16bit integer offset to resource records; the    */
    /* size of a resource record is 12 bytes.  The map header is 28 bytes, */
    /* and a type list needs 10 bytes or more.  If we assume that the name */
    /* list is empty and we have only a single entry in the type list,     */
    /* there can be at most                                                */
    /*                                                                     */
    /*   (32768 - 28 - 10) / 12 = 2727                                     */
    /*                                                                     */
    /* resources.                                                          */
    /*                                                                     */
    /* A type list starts with a two-byte counter, followed by 10-byte     */
    /* type records.  Assuming that there are no resources, the number of  */
    /* type records can be at most                                         */
    /*                                                                     */
    /*   (32768 - 28 - 2) / 8 = 4079                                       */
    /*                                                                     */
    if ( cnt > 4079 )
      return FT_THROW( Invalid_Table );

    for ( i = 0; i < cnt; i++ )
    {
      if ( FT_READ_LONG( tag_internal ) ||
           FT_READ_SHORT( subcnt )      ||
           FT_READ_SHORT( rpos )        )
        return error;

      FT_TRACE2(( "Resource tags: %c%c%c%c\n",
                  (char)( 0xFF & ( tag_internal >> 24 ) ),
                  (char)( 0xFF & ( tag_internal >> 16 ) ),
                  (char)( 0xFF & ( tag_internal >>  8 ) ),
                  (char)( 0xFF & ( tag_internal >>  0 ) ) ));
      FT_TRACE3(( "             : subcount=%d, suboffset=0x%04lx\n",
                  subcnt, rpos ));

      if ( tag_internal == tag )
      {
        *count = subcnt + 1;
        rpos  += map_offset;

        /* a zero count might be valid in the resource specification, */
        /* however, it is completely useless to us                    */
        if ( *count < 1 || *count > 2727 )
          return FT_THROW( Invalid_Table );

        error = FT_Stream_Seek( stream, (FT_ULong)rpos );
        if ( error )
          return error;

        if ( FT_QNEW_ARRAY( ref, *count ) )
          return error;

        for ( j = 0; j < *count; j++ )
        {
          if ( FT_READ_SHORT( ref[j].res_id ) )
            goto Exit;
          if ( FT_STREAM_SKIP( 2 ) )  /* resource name offset */
            goto Exit;
          if ( FT_READ_LONG( temp ) ) /* attributes (8bit), offset (24bit) */
            goto Exit;
          if ( FT_STREAM_SKIP( 4 ) )  /* mbz */
            goto Exit;

          /*
           * According to Inside Macintosh: More Macintosh Toolbox,
           * "Resource IDs" (1-46), there are some reserved IDs.
           * However, FreeType2 is not a font synthesizer, no need
           * to check the acceptable resource ID.
           */
          if ( temp < 0 )
          {
            error = FT_THROW( Invalid_Table );
            goto Exit;
          }

          ref[j].offset = temp & 0xFFFFFFL;

          FT_TRACE3(( "             [%d]:"
                      " resource_id=0x%04x, offset=0x%08lx\n",
                      j, (FT_UShort)ref[j].res_id, ref[j].offset ));
        }

        if ( sort_by_res_id )
        {
          ft_qsort( ref,
                    (size_t)*count,
                    sizeof ( FT_RFork_Ref ),
                    ft_raccess_sort_ref_by_id );

          FT_TRACE3(( "             -- sort resources by their ids --\n" ));

          for ( j = 0; j < *count; j++ )
            FT_TRACE3(( "             [%d]:"
                        " resource_id=0x%04x, offset=0x%08lx\n",
                        j, ref[j].res_id, ref[j].offset ));
        }

        if ( FT_QNEW_ARRAY( offsets_internal, *count ) )
          goto Exit;

        /* XXX: duplicated reference ID,
         *      gap between reference IDs are acceptable?
         *      further investigation on Apple implementation is needed.
         */
        for ( j = 0; j < *count; j++ )
          offsets_internal[j] = rdata_pos + ref[j].offset;

        *offsets = offsets_internal;
        error    = FT_Err_Ok;

      Exit:
        FT_FREE( ref );
        return error;
      }
    }

    return FT_THROW( Cannot_Open_Resource );
  }